

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O3

CURLcode imap_perform_authentication(Curl_easy *data,connectdata *conn)

{
  SASL *sasl;
  _Bool _Var1;
  CURLcode CVar2;
  saslprogress progress;
  saslprogress local_1c;
  
  if ((conn->proto).imapc.preauth == false) {
    sasl = &(conn->proto).imapc.sasl;
    _Var1 = Curl_sasl_can_authenticate(sasl,conn);
    if (_Var1) {
      CVar2 = Curl_sasl_start(sasl,data,conn,(conn->proto).imapc.ir_supported,&local_1c);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      if (local_1c == SASL_INPROGRESS) {
        (data->conn->proto).imapc.state = IMAP_AUTHENTICATE;
        return CURLE_OK;
      }
      if (((conn->proto).imapc.login_disabled == false) &&
         ((*(byte *)((long)&conn->proto + 0xa8) & 1) != 0)) {
        CVar2 = imap_perform_login(data,conn);
        return CVar2;
      }
      Curl_infof(data,"No known authentication mechanisms supported!");
      return CURLE_LOGIN_DENIED;
    }
  }
  (data->conn->proto).imapc.state = IMAP_STOP;
  return CURLE_OK;
}

Assistant:

static CURLcode imap_perform_authentication(struct Curl_easy *data,
                                            struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct imap_conn *imapc = &conn->proto.imapc;
  saslprogress progress;

  /* Check if already authenticated OR if there is enough data to authenticate
     with and end the connect phase if we don't */
  if(imapc->preauth ||
     !Curl_sasl_can_authenticate(&imapc->sasl, conn)) {
    state(data, IMAP_STOP);
    return result;
  }

  /* Calculate the SASL login details */
  result = Curl_sasl_start(&imapc->sasl, data, conn,
                           imapc->ir_supported, &progress);

  if(!result) {
    if(progress == SASL_INPROGRESS)
      state(data, IMAP_AUTHENTICATE);
    else if(!imapc->login_disabled && (imapc->preftype & IMAP_TYPE_CLEARTEXT))
      /* Perform clear text authentication */
      result = imap_perform_login(data, conn);
    else {
      /* Other mechanisms not supported */
      infof(data, "No known authentication mechanisms supported!");
      result = CURLE_LOGIN_DENIED;
    }
  }

  return result;
}